

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldTypes.h
# Opt level: O3

void __thiscall
FIX::DateTime::DateTime
          (DateTime *this,int year,int month,int day,int hour,int minute,int second,int fraction,
          int precision)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  this->_vptr_DateTime = (_func_int **)&PTR__DateTime_001ea8d0;
  iVar1 = (0xe - month) / 0xc;
  iVar3 = year - iVar1;
  iVar4 = iVar3 + 0x12c0;
  iVar3 = iVar3 + 0x12c3;
  if (-1 < iVar4) {
    iVar3 = iVar4;
  }
  iVar2 = (int)((ulong)((long)iVar4 * -0x51eb851f) >> 0x20);
  this->m_date = iVar4 * 0x16d + day + (iVar3 >> 2) + ((iVar2 >> 5) - (iVar2 >> 0x1f)) + iVar4 / 400
                 + ((month + iVar1 * 0xc) * 0x99 + -0x1c9) / 5 + -0x7d2d;
  iVar4 = convertToNanos(fraction,precision);
  this->m_time = (long)iVar4 +
                 ((long)minute * 0x3c + (long)hour * 0xe10 + (long)second) * 1000000000;
  return;
}

Assistant:

DateTime( int year, int month, int day,
            int hour, int minute, int second, int fraction, int precision )
  {
    m_date = julianDate( year, month, day );
    int nanos = convertToNanos(fraction, precision);
    m_time = makeHMS( hour, minute, second, nanos );
  }